

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.cpp
# Opt level: O0

void __thiscall de::BlockBufferBasicTest::Producer::run(Producer *this)

{
  bool bVar1;
  int max;
  Producer *__n;
  deUint16 payload;
  Message *local_148;
  Message local_140;
  int local_13c;
  int local_138;
  int ndx;
  int writeSize;
  Message local_128 [2];
  Message tmpBuf [64];
  undefined1 local_20 [4];
  int msgNdx;
  Random rnd;
  Producer *this_local;
  
  rnd.m_rnd._8_8_ = this;
  deSleep(1);
  Random::Random((Random *)local_20,(uint)this->m_threadId);
  tmpBuf[0x3f].data = 0;
  local_148 = local_128;
  do {
    Message::Message(local_148);
    local_148 = local_148 + 1;
  } while (local_148 != tmpBuf + 0x3e);
  while ((int)tmpBuf[0x3f].data < this->m_numMessages) {
    __n = this;
    max = min<int>(this->m_numMessages - tmpBuf[0x3f].data,0x40);
    local_138 = Random::getInt((Random *)local_20,1,max);
    for (local_13c = 0; local_13c < local_138; local_13c = local_13c + 1) {
      payload = (deUint16)tmpBuf[0x3f].data;
      tmpBuf[0x3f].data = tmpBuf[0x3f].data + 1;
      Message::Message(&local_140,this->m_threadId,payload);
      __n = (Producer *)(ulong)local_140.data;
      tmpBuf[(long)local_13c + -2].data = local_140.data;
    }
    BlockBuffer<de::BlockBufferBasicTest::Message>::write
              (this->m_buffer,local_138,local_128,(size_t)__n);
    bVar1 = Random::getBool((Random *)local_20);
    if (bVar1) {
      BlockBuffer<de::BlockBufferBasicTest::Message>::flush(this->m_buffer);
    }
  }
  Random::~Random((Random *)local_20);
  return;
}

Assistant:

void run (void)
	{
		// Yield to give main thread chance to start other producers.
		deSleep(1);

		Random	rnd		(m_threadId);
		int		msgNdx	= 0;
		Message	tmpBuf[64];

		while (msgNdx < m_numMessages)
		{
			int writeSize = rnd.getInt(1, de::min(m_numMessages-msgNdx, DE_LENGTH_OF_ARRAY(tmpBuf)));
			for (int ndx = 0; ndx < writeSize; ndx++)
				tmpBuf[ndx] = Message(m_threadId, (deUint16)msgNdx++);

			m_buffer.write(writeSize, &tmpBuf[0]);
			if (rnd.getBool())
				m_buffer.flush();
		}
	}